

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void sendBtnsState(fnode_service_t *service,string *btnsState)

{
  int iVar1;
  
  if (sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::
                                 packet_abi_cxx11_);
    if (iVar1 != 0) {
      sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_._M_dataplus._M_p
           = (pointer)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_.
                       field_2;
      sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_._M_string_length
           = 0;
      sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_.field_2.
      _M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::
                           packet_abi_cxx11_);
    }
  }
  sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_._M_string_length = 0;
  *sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_._M_dataplus._M_p =
       '\0';
  std::__cxx11::string::append
            ((char *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_);
  std::__cxx11::string::append
            ((string *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_
            );
  while (sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_.
         _M_string_length < 9) {
    std::__cxx11::string::append
              ((char *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_
              );
  }
  if (service != (fnode_service_t *)0x0) {
    fnode_service_notify_state
              (service,sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_.
                       _M_dataplus._M_p,
               (uint32_t)
               sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_.
               _M_string_length);
    return;
  }
  return;
}

Assistant:

void sendBtnsState(fnode_service_t * service, const string& btnsState)
{
    static string packet;
    packet.clear();
    packet.append("0");
    packet.append(btnsState);
    while(packet.length() < 9)
        packet.append("0");
    if(service)
        fnode_service_notify_state(service, packet.c_str(), packet.length());
}